

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetDefinition(cmMakefile *this,string *name)

{
  bool bVar1;
  cmState *pcVar2;
  cmVariableWatch *this_00;
  bool watch_function_executed;
  cmVariableWatch *vv;
  char *def;
  string *name_local;
  cmMakefile *this_local;
  
  vv = (cmVariableWatch *)cmState::Snapshot::GetDefinition(&this->StateSnapshot,name);
  if (vv == (cmVariableWatch *)0x0) {
    pcVar2 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(pcVar2,name);
  }
  this_00 = GetVariableWatch(this);
  if ((((this_00 != (cmVariableWatch *)0x0) && ((this->SuppressWatches & 1U) == 0)) &&
      (bVar1 = cmVariableWatch::VariableAccessed
                         (this_00,name,(uint)(vv == (cmVariableWatch *)0x0),(char *)vv,this), bVar1)
      ) && (vv = (cmVariableWatch *)cmState::Snapshot::GetDefinition(&this->StateSnapshot,name),
           vv == (cmVariableWatch *)0x0)) {
    pcVar2 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(pcVar2,name);
  }
  return (char *)vv;
}

Assistant:

const char* cmMakefile::GetDefinition(const std::string& name) const
{
  const char* def = this->StateSnapshot.GetDefinition(name);
  if(!def)
    {
    def = this->GetState()->GetInitializedCacheValue(name);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv && !this->SuppressWatches )
    {
    bool const watch_function_executed =
      vv->VariableAccessed(name,
                           def ? cmVariableWatch::VARIABLE_READ_ACCESS
                           : cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS,
                           def, this);

    if (watch_function_executed)
      {
      // A callback was executed and may have caused re-allocation of the
      // variable storage.  Look it up again for now.
      // FIXME: Refactor variable storage to avoid this problem.
      def = this->StateSnapshot.GetDefinition(name);
      if(!def)
        {
        def = this->GetState()->GetInitializedCacheValue(name);
        }
      }
    }
#endif
  return def;
}